

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  int remain_7;
  int iVar9;
  uchar uVar10;
  int remain_1;
  int iVar11;
  float *pfVar12;
  float *pfVar13;
  Mat local_70;
  
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      iVar4 = this->w;
      local_70.h = this->h;
      iVar1 = iVar4 * -3 + stride;
      iVar2 = local_70.h * iVar4;
      iVar9 = 0;
      if (0 < local_70.h) {
        iVar9 = local_70.h;
      }
      pfVar5 = (float *)this->data;
      local_70.elemsize = this->elemsize;
      local_70.elempack = this->elempack;
      local_70.allocator = this->allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)iVar2;
      local_70.data = pfVar5;
      local_70.w = iVar4;
      ~Mat(&local_70);
      channel(&local_70,this,1);
      pfVar13 = (float *)local_70.data;
      ~Mat(&local_70);
      channel(&local_70,this,2);
      pfVar12 = (float *)local_70.data;
      ~Mat(&local_70);
      if (iVar1 != 0) {
        iVar2 = iVar4;
      }
      if (iVar1 == 0) {
        iVar9 = 1;
      }
      puVar3 = pixels;
      for (iVar4 = 0; iVar7 = iVar2, iVar4 != iVar9; iVar4 = iVar4 + 1) {
        for (; 0 < iVar7; iVar7 = iVar7 + -1) {
          iVar8 = (int)*pfVar5;
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          *puVar3 = (uchar)iVar8;
          iVar8 = (int)*pfVar13;
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          puVar3[1] = (uchar)iVar8;
          iVar8 = (int)*pfVar12;
          if ((int)*pfVar12 < 1) {
            iVar8 = 0;
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          puVar3[2] = (uchar)iVar8;
          puVar3 = puVar3 + 3;
          pfVar5 = pfVar5 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar12 = pfVar12 + 1;
        }
        puVar3 = puVar3 + iVar1;
      }
    }
    if (type == 3) {
      iVar4 = this->w;
      iVar9 = this->h;
      iVar2 = 0;
      if (0 < iVar9) {
        iVar2 = iVar9;
      }
      iVar7 = stride - iVar4;
      iVar1 = 1;
      if (iVar7 == 0) {
        iVar2 = iVar1;
        iVar1 = iVar9;
      }
      pfVar5 = (float *)this->data;
      puVar3 = pixels;
      for (iVar9 = 0; iVar8 = iVar1 * iVar4, iVar9 != iVar2; iVar9 = iVar9 + 1) {
        for (; 0 < iVar8; iVar8 = iVar8 + -1) {
          iVar11 = (int)*pfVar5;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          *puVar3 = (uchar)iVar11;
          puVar3 = puVar3 + 1;
          pfVar5 = pfVar5 + 1;
        }
        puVar3 = puVar3 + iVar7;
      }
    }
    if ((type & 0xfffeU) != 4) {
      return;
    }
    iVar4 = this->w;
    local_70.h = this->h;
    iVar9 = local_70.h * iVar4;
    iVar1 = 0;
    iVar2 = 0;
    if (0 < local_70.h) {
      iVar2 = local_70.h;
    }
    pfVar5 = (float *)this->data;
    local_70.elemsize = this->elemsize;
    local_70.elempack = this->elempack;
    local_70.allocator = this->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 2;
    local_70.c = 1;
    local_70.cstep = (size_t)iVar9;
    local_70.data = pfVar5;
    local_70.w = iVar4;
    ~Mat(&local_70);
    channel(&local_70,this,1);
    pfVar13 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,2);
    pfVar12 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,3);
    pfVar6 = (float *)local_70.data;
    ~Mat(&local_70);
    iVar7 = stride + iVar4 * -4;
    if (iVar7 != 0) {
      iVar9 = iVar4;
    }
    if (iVar7 == 0) {
      iVar2 = 1;
    }
    for (iVar4 = 0; iVar8 = iVar9, iVar4 != iVar2; iVar4 = iVar4 + 1) {
      for (; 0 < iVar8; iVar8 = iVar8 + -1) {
        iVar11 = (int)*pfVar5;
        if ((int)*pfVar5 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        *pixels = (uchar)iVar11;
        iVar11 = (int)*pfVar13;
        if ((int)*pfVar13 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pixels[1] = (uchar)iVar11;
        iVar11 = (int)*pfVar12;
        if ((int)*pfVar12 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pixels[2] = (uchar)iVar11;
        iVar11 = (int)*pfVar6;
        if ((int)*pfVar6 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pixels[3] = (uchar)iVar11;
        pixels = pixels + 4;
        pfVar5 = pfVar5 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar12 = pfVar12 + 1;
        pfVar6 = pfVar6 + 1;
      }
      pixels = pixels + iVar7;
    }
    return;
  }
  switch(type) {
  case 0x40001:
switchD_0012a0af_caseD_50002:
    iVar4 = this->w;
    local_70.h = this->h;
    iVar2 = local_70.h * iVar4;
    iVar9 = 0;
    if (0 < local_70.h) {
      iVar9 = local_70.h;
    }
    pfVar5 = (float *)this->data;
    local_70.elemsize = this->elemsize;
    local_70.elempack = this->elempack;
    local_70.allocator = this->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 2;
    local_70.c = 1;
    local_70.cstep = (size_t)iVar2;
    local_70.data = pfVar5;
    local_70.w = iVar4;
    ~Mat(&local_70);
    channel(&local_70,this,1);
    pfVar13 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,2);
    pfVar12 = (float *)local_70.data;
    ~Mat(&local_70);
    iVar1 = stride + iVar4 * -4;
    if (iVar1 != 0) {
      iVar2 = iVar4;
    }
    if (iVar1 == 0) {
      iVar9 = 1;
    }
    for (iVar4 = 0; iVar7 = iVar2, iVar4 != iVar9; iVar4 = iVar4 + 1) {
      for (; 0 < iVar7; iVar7 = iVar7 + -1) {
        iVar8 = (int)*pfVar5;
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        *pixels = (uchar)iVar8;
        iVar8 = (int)*pfVar13;
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        pixels[1] = (uchar)iVar8;
        iVar8 = (int)*pfVar12;
        if ((int)*pfVar12 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        pixels[2] = (uchar)iVar8;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar5 = pfVar5 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar1;
    }
    break;
  case 0x40002:
switchD_0012a0af_caseD_50001:
    iVar4 = this->w;
    local_70.h = this->h;
    iVar2 = local_70.h * iVar4;
    iVar9 = 0;
    if (0 < local_70.h) {
      iVar9 = local_70.h;
    }
    pfVar5 = (float *)this->data;
    local_70.elemsize = this->elemsize;
    local_70.elempack = this->elempack;
    local_70.allocator = this->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 2;
    local_70.c = 1;
    local_70.cstep = (size_t)iVar2;
    local_70.data = pfVar5;
    local_70.w = iVar4;
    ~Mat(&local_70);
    channel(&local_70,this,1);
    pfVar13 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,2);
    pfVar12 = (float *)local_70.data;
    ~Mat(&local_70);
    iVar1 = stride + iVar4 * -4;
    if (iVar1 != 0) {
      iVar2 = iVar4;
    }
    if (iVar1 == 0) {
      iVar9 = 1;
    }
    for (iVar4 = 0; iVar7 = iVar2, iVar4 != iVar9; iVar4 = iVar4 + 1) {
      for (; 0 < iVar7; iVar7 = iVar7 + -1) {
        iVar8 = (int)*pfVar12;
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        *pixels = (uchar)iVar8;
        iVar8 = (int)*pfVar13;
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        pixels[1] = (uchar)iVar8;
        iVar8 = (int)*pfVar5;
        if ((int)*pfVar5 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        pixels[2] = (uchar)iVar8;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar5 = pfVar5 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar1;
    }
    break;
  case 0x40003:
switchD_0012a0af_caseD_50003:
    iVar4 = this->w;
    iVar9 = this->h;
    iVar2 = 0;
    if (0 < iVar9) {
      iVar2 = iVar9;
    }
    iVar7 = stride + iVar4 * -4;
    iVar1 = 1;
    if (iVar7 == 0) {
      iVar2 = iVar1;
      iVar1 = iVar9;
    }
    pfVar5 = (float *)this->data;
    for (iVar9 = 0; iVar8 = iVar1 * iVar4, iVar9 != iVar2; iVar9 = iVar9 + 1) {
      for (; 0 < iVar8; iVar8 = iVar8 + -1) {
        iVar11 = (int)*pfVar5;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        uVar10 = (uchar)iVar11;
        *pixels = uVar10;
        pixels[1] = uVar10;
        pixels[2] = uVar10;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar5 = pfVar5 + 1;
      }
      pixels = pixels + iVar7;
    }
    return;
  case 0x40004:
    break;
  case 0x40005:
switchD_0012a0af_caseD_50004:
    iVar4 = this->w;
    local_70.h = this->h;
    iVar9 = local_70.h * iVar4;
    iVar1 = 0;
    iVar2 = 0;
    if (0 < local_70.h) {
      iVar2 = local_70.h;
    }
    pfVar5 = (float *)this->data;
    local_70.elemsize = this->elemsize;
    local_70.elempack = this->elempack;
    local_70.allocator = this->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 2;
    local_70.c = 1;
    local_70.cstep = (size_t)iVar9;
    local_70.data = pfVar5;
    local_70.w = iVar4;
    ~Mat(&local_70);
    channel(&local_70,this,1);
    pfVar13 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,2);
    pfVar12 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,3);
    pfVar6 = (float *)local_70.data;
    ~Mat(&local_70);
    iVar7 = stride + iVar4 * -4;
    if (iVar7 != 0) {
      iVar9 = iVar4;
    }
    if (iVar7 == 0) {
      iVar2 = 1;
    }
    for (iVar4 = 0; iVar8 = iVar9, iVar4 != iVar2; iVar4 = iVar4 + 1) {
      for (; 0 < iVar8; iVar8 = iVar8 + -1) {
        iVar11 = (int)*pfVar12;
        if ((int)*pfVar12 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        *pixels = (uchar)iVar11;
        iVar11 = (int)*pfVar13;
        if ((int)*pfVar13 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pixels[1] = (uchar)iVar11;
        iVar11 = (int)*pfVar5;
        if ((int)*pfVar5 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pixels[2] = (uchar)iVar11;
        iVar11 = (int)*pfVar6;
        if ((int)*pfVar6 < 1) {
          iVar11 = iVar1;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pixels[3] = (uchar)iVar11;
        pixels = pixels + 4;
        pfVar5 = pfVar5 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar12 = pfVar12 + 1;
        pfVar6 = pfVar6 + 1;
      }
      pixels = pixels + iVar7;
    }
    return;
  default:
    switch(type) {
    case 0x50001:
      goto switchD_0012a0af_caseD_50001;
    case 0x50002:
      goto switchD_0012a0af_caseD_50002;
    case 0x50003:
      goto switchD_0012a0af_caseD_50003;
    case 0x50004:
      goto switchD_0012a0af_caseD_50004;
    default:
      if ((type != 0x20001) && (type != 0x10002)) {
        return;
      }
      iVar4 = this->w;
      local_70.h = this->h;
      iVar1 = iVar4 * -3 + stride;
      iVar2 = local_70.h * iVar4;
      iVar7 = 0;
      iVar9 = 0;
      if (0 < local_70.h) {
        iVar9 = local_70.h;
      }
      pfVar5 = (float *)this->data;
      local_70.elemsize = this->elemsize;
      local_70.elempack = this->elempack;
      local_70.allocator = this->allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)iVar2;
      local_70.data = pfVar5;
      local_70.w = iVar4;
      ~Mat(&local_70);
      channel(&local_70,this,1);
      pfVar13 = (float *)local_70.data;
      ~Mat(&local_70);
      channel(&local_70,this,2);
      pfVar12 = (float *)local_70.data;
      ~Mat(&local_70);
      if (iVar1 != 0) {
        iVar2 = iVar4;
      }
      if (iVar1 == 0) {
        iVar9 = 1;
      }
      for (iVar4 = 0; iVar8 = iVar2, iVar4 != iVar9; iVar4 = iVar4 + 1) {
        for (; 0 < iVar8; iVar8 = iVar8 + -1) {
          iVar11 = (int)*pfVar5;
          if ((int)*pfVar5 < 1) {
            iVar11 = iVar7;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pixels[2] = (uchar)iVar11;
          iVar11 = (int)*pfVar13;
          if ((int)*pfVar13 < 1) {
            iVar11 = iVar7;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pixels[1] = (uchar)iVar11;
          iVar11 = (int)*pfVar12;
          if ((int)*pfVar12 < 1) {
            iVar11 = iVar7;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          *pixels = (uchar)iVar11;
          pixels = pixels + 3;
          pfVar5 = pfVar5 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar12 = pfVar12 + 1;
        }
        pixels = pixels + iVar1;
      }
      return;
    }
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            to_gray2rgba(*this, pixels, stride);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            to_rgba2bgra(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            to_rgba(*this, pixels, stride);
    }
}